

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O1

int mriStep_SetDefaults(ARKodeMem ark_mem)

{
  int iVar1;
  ARKodeMRIStepMem step_mem;
  sunindextype Cleniw;
  sunindextype Clenrw;
  ARKodeMRIStepMem local_30;
  long local_28;
  long local_20;
  
  iVar1 = mriStep_AccessStepMem(ark_mem,"mriStep_SetDefaults",&local_30);
  if (iVar1 == 0) {
    local_30->q = 3;
    local_30->p = 0;
    local_30->predictor = 0;
    local_30->linear = 0;
    local_30->linear_timedep = 1;
    local_30->deduce_rhs = 0;
    local_30->maxcor = 3;
    local_30->nlscoef = 0.1;
    *(undefined4 *)&local_30->crdown = 0x33333333;
    *(undefined4 *)((long)&local_30->crdown + 4) = 0x3fd33333;
    *(undefined4 *)&local_30->rdiv = 0x66666666;
    *(undefined4 *)((long)&local_30->rdiv + 4) = 0x40026666;
    local_30->dgmax = 0.2;
    local_30->msbp = 0x14;
    local_30->stages = 0;
    local_30->istage = 0;
    local_30->convfail = 0;
    local_30->jcur = 0;
    local_30->stage_predict = (ARKStagePredictFn)0x0;
    if ((local_30->NLS != (SUNNonlinearSolver)0x0) && (local_30->ownNLS != 0)) {
      SUNNonlinSolFree();
    }
    local_30->NLS = (SUNNonlinearSolver)0x0;
    if (local_30->MRIC != (MRIStepCoupling)0x0) {
      MRIStepCoupling_Space(local_30->MRIC,&local_28,&local_20);
      ark_mem->lrw = ark_mem->lrw - local_20;
      ark_mem->liw = ark_mem->liw - local_28;
      MRIStepCoupling_Free(local_30->MRIC);
    }
    local_30->MRIC = (MRIStepCoupling)0x0;
    iVar1 = arkReplaceAdaptController(ark_mem,(SUNAdaptController)0x0,1);
  }
  return iVar1;
}

Assistant:

int mriStep_SetDefaults(ARKodeMem ark_mem)
{
  ARKodeMRIStepMem step_mem;
  sunindextype Clenrw, Cleniw;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Set default values for integrator optional inputs */
  step_mem->q              = 3;        /* method order */
  step_mem->p              = 0;        /* embedding order */
  step_mem->predictor      = 0;        /* trivial predictor */
  step_mem->linear         = SUNFALSE; /* nonlinear problem */
  step_mem->linear_timedep = SUNTRUE;  /* dfs/dy depends on t */
  step_mem->deduce_rhs     = SUNFALSE; /* deduce fi on result of NLS */
  step_mem->maxcor         = MAXCOR;   /* max nonlinear iters/stage */
  step_mem->nlscoef        = NLSCOEF;  /* nonlinear tolerance coefficient */
  step_mem->crdown         = CRDOWN; /* nonlinear convergence estimate coeff. */
  step_mem->rdiv           = RDIV;   /* nonlinear divergence tolerance */
  step_mem->dgmax          = DGMAX;  /* max gamma change to recompute J or P */
  step_mem->msbp           = MSBP;   /* max steps between updating J or P */
  step_mem->stages         = 0;      /* no stages */
  step_mem->istage         = 0;      /* current stage index */
  step_mem->jcur           = SUNFALSE;
  step_mem->convfail       = ARK_NO_FAILURES;
  step_mem->stage_predict  = NULL; /* no user-supplied stage predictor */

  /* Remove pre-existing nonlinear solver object */
  if (step_mem->NLS && step_mem->ownNLS) { SUNNonlinSolFree(step_mem->NLS); }
  step_mem->NLS = NULL;

  /* Remove pre-existing coupling table */
  if (step_mem->MRIC)
  {
    MRIStepCoupling_Space(step_mem->MRIC, &Cleniw, &Clenrw);
    ark_mem->lrw -= Clenrw;
    ark_mem->liw -= Cleniw;
    MRIStepCoupling_Free(step_mem->MRIC);
  }
  step_mem->MRIC = NULL;

  /* Load the default SUNAdaptController */
  retval = arkReplaceAdaptController(ark_mem, NULL, SUNTRUE);
  if (retval) { return retval; }

  return (ARK_SUCCESS);
}